

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int __thiscall fmt::v6::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *in_RAX;
  long lVar6;
  long lVar7;
  long lVar8;
  char *unaff_RBX;
  uint uVar9;
  
  if (this == divisor) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  iVar3 = compare(this,divisor);
  if (iVar3 < 0) {
    iVar3 = 0;
  }
  else {
    if ((divisor->bigits_).super_buffer<unsigned_int>.ptr_
        [(divisor->bigits_).super_buffer<unsigned_int>.size_ - 1] == 0) {
      assert_fail(unaff_RBX,0,in_RAX);
    }
    uVar9 = this->exp_ - divisor->exp_;
    if (uVar9 != 0 && divisor->exp_ <= this->exp_) {
      iVar3 = (int)(this->bigits_).super_buffer<unsigned_int>.size_;
      uVar4 = uVar9 + iVar3;
      if ((int)uVar4 < 0) {
        assert_fail(unaff_RBX,0,in_RAX);
      }
      if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < (ulong)uVar4) {
        (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
      }
      (this->bigits_).super_buffer<unsigned_int>.size_ = (ulong)uVar4;
      if (0 < iVar3) {
        puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
        lVar8 = (long)(int)(uVar9 + iVar3 + -1);
        lVar6 = (ulong)(iVar3 - 1) + 1;
        do {
          puVar1[lVar8] = puVar1[lVar6 + -1];
          lVar8 = lVar8 + -1;
          lVar7 = lVar6 + -1;
          bVar2 = 0 < lVar6;
          lVar6 = lVar7;
        } while (lVar7 != 0 && bVar2);
      }
      memset((this->bigits_).super_buffer<unsigned_int>.ptr_,0,(ulong)uVar9 << 2);
      this->exp_ = this->exp_ - uVar9;
    }
    iVar3 = 0;
    do {
      subtract_aligned(this,divisor);
      iVar3 = iVar3 + 1;
      iVar5 = compare(this,divisor);
    } while (-1 < iVar5);
  }
  return iVar3;
}

Assistant:

int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    int num_bigits = static_cast<int>(bigits_.size());
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    int exp_difference = exp_ - divisor.exp_;
    if (exp_difference > 0) {
      // Align bigints by adding trailing zeros to simplify subtraction.
      bigits_.resize(to_unsigned(num_bigits + exp_difference));
      for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
        bigits_[j] = bigits_[i];
      std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
      exp_ -= exp_difference;
    }
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }